

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,block_statement *s)

{
  bool bVar1;
  statement_list *this_00;
  reference this_01;
  type s_00;
  unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *bs;
  const_iterator __end2;
  const_iterator __begin2;
  statement_list *__range2;
  block_statement *s_local;
  print_visitor *this_local;
  
  std::operator<<(this->os_,'{');
  this_00 = block_statement::l(s);
  __end2 = std::
           vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
           ::begin(this_00);
  bs = (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
       std::
       vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
       ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
                                *)&bs);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
              ::operator*(&__end2);
    s_00 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*(this_01)
    ;
    accept<mjs::print_visitor>(s_00,this);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
    ::operator++(&__end2);
  }
  std::operator<<(this->os_,'}');
  return;
}

Assistant:

void operator()(const block_statement& s) {
        os_ << '{';
        for (const auto& bs: s.l()) {
            accept(*bs, *this);
        }
        os_ << '}';
    }